

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O3

REF_STATUS ref_smooth_node_same_normal(REF_GRID ref_grid,REF_INT node,REF_BOOL *allowed)

{
  REF_ADJ pRVar1;
  REF_ADJ_ITEM pRVar2;
  uint uVar3;
  undefined4 *in_RCX;
  undefined8 uVar4;
  REF_STATUS RVar5;
  ulong uVar6;
  bool bVar7;
  undefined4 in_register_00000034;
  REF_CELL ref_cell;
  char *pcVar8;
  long lVar9;
  REF_DBL normal [3];
  REF_INT nodes [27];
  double local_e8;
  double dStack_e0;
  double local_d8;
  double local_c8;
  double dStack_c0;
  double local_b8;
  REF_INT local_a8 [30];
  
  ref_cell = (REF_CELL)CONCAT44(in_register_00000034,node);
  *in_RCX = 1;
  pRVar1 = ref_cell->ref_adj;
  RVar5 = 0;
  if (((int)allowed < pRVar1->nnode) &&
     (lVar9 = (long)pRVar1->first[(ulong)allowed & 0xffffffff], lVar9 != -1)) {
    uVar3 = ref_cell_nodes(ref_cell,pRVar1->item[lVar9].ref,local_a8);
    if (uVar3 == 0) {
      bVar7 = false;
      do {
        uVar3 = ref_node_tri_normal((REF_NODE)ref_grid,local_a8,&local_e8);
        if (uVar3 != 0) {
          uVar6 = (ulong)uVar3;
          pcVar8 = "orig normal";
          uVar4 = 0x3e3;
          goto LAB_001cee62;
        }
        if (!bVar7) {
          local_c8 = local_e8;
          dStack_c0 = dStack_e0;
          local_b8 = local_d8;
          uVar3 = ref_math_normalize(&local_c8);
          if (uVar3 != 0) {
            uVar6 = (ulong)uVar3;
            pcVar8 = "original triangle has zero area";
            uVar4 = 0x3e9;
            goto LAB_001cee62;
          }
        }
        uVar3 = ref_math_normalize(&local_e8);
        if (uVar3 != 0) {
          uVar6 = (ulong)uVar3;
          if (uVar3 == 4) {
LAB_001cef5b:
            *in_RCX = 0;
            return 0;
          }
          pcVar8 = "new normal length";
          uVar4 = 0x3f0;
          goto LAB_001cee62;
        }
        if (local_b8 * local_d8 + local_c8 * local_e8 + dStack_c0 * dStack_e0 <
            (double)ref_grid->cell[0xf]) goto LAB_001cef5b;
        pRVar2 = ref_cell->ref_adj->item;
        lVar9 = (long)pRVar2[(int)lVar9].next;
        if (lVar9 == -1) {
          return 0;
        }
        uVar3 = ref_cell_nodes(ref_cell,pRVar2[lVar9].ref,local_a8);
        bVar7 = true;
      } while (uVar3 == 0);
    }
    uVar6 = (ulong)uVar3;
    pcVar8 = "nodes";
    uVar4 = 0x3e2;
LAB_001cee62:
    RVar5 = (REF_STATUS)uVar6;
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",uVar4,
           "ref_smooth_node_same_normal",uVar6,pcVar8);
  }
  return RVar5;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_node_same_normal(REF_GRID ref_grid,
                                                      REF_INT node,
                                                      REF_BOOL *allowed) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell = ref_grid_tri(ref_grid);
  REF_INT item, cell;
  REF_INT nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL normal[3], first_normal[3];
  REF_DBL dot;
  REF_STATUS status;
  REF_BOOL first_tri;

  *allowed = REF_TRUE;

  first_tri = REF_TRUE;
  each_ref_cell_having_node(ref_cell, node, item, cell) {
    RSS(ref_cell_nodes(ref_cell, cell, nodes), "nodes");
    RSS(ref_node_tri_normal(ref_node, nodes, normal), "orig normal");
    if (first_tri) {
      first_tri = REF_FALSE;
      first_normal[0] = normal[0];
      first_normal[1] = normal[1];
      first_normal[2] = normal[2];
      RSS(ref_math_normalize(first_normal), "original triangle has zero area");
    }
    status = ref_math_normalize(normal);
    if (REF_DIV_ZERO == status) { /* new triangle face has zero area */
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
    RSS(status, "new normal length");
    dot = ref_math_dot(first_normal, normal);
    if (dot < ref_node_same_normal_tol(ref_node)) {
      *allowed = REF_FALSE;
      return REF_SUCCESS;
    }
  }

  return REF_SUCCESS;
}